

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  __type _Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  cmake *pcVar10;
  cmState *this_00;
  reference pvVar11;
  char *pcVar12;
  long lVar13;
  size_type sVar14;
  size_t sVar15;
  ulong uVar16;
  ostream *poVar17;
  bool local_96b;
  string local_8f0 [32];
  undefined1 local_8d0 [8];
  ostringstream emsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  string local_6f8;
  allocator local_6d1;
  undefined1 local_6d0 [8];
  string varresult_1;
  undefined1 local_6a8 [8];
  string variable;
  char *nextAt;
  char nextc_1;
  char *next_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  char local_601;
  char *pcStack_600;
  char nextc;
  char *start;
  char *next;
  t_lookup lookup_1;
  allocator local_5b9;
  string local_5b8;
  string local_598;
  cmState *local_578;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_570;
  PositionType local_568;
  undefined1 local_560 [8];
  cmOutputConverter converter;
  cmListFileContext lfc;
  ostringstream msg;
  allocator local_379;
  string local_378;
  byte local_353;
  byte local_352;
  allocator local_351;
  string local_350;
  byte local_32b;
  byte local_32a;
  allocator local_329;
  string local_328;
  byte local_303;
  byte local_302;
  allocator local_301;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  string local_2b8;
  string local_298 [32];
  ostringstream local_278 [8];
  ostringstream ostr;
  allocator local_f9;
  string local_f8 [8];
  string varresult;
  char *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  string *lookup;
  t_lookup var;
  char inc;
  cmState *state;
  MessageType mtype;
  bool done;
  bool error;
  vector<t_lookup,_std::allocator<t_lookup>_> openstack;
  string local_58 [8];
  string result;
  char *last;
  char *in;
  bool replaceAt_local;
  bool removeEmpty_local;
  bool atOnly_local;
  bool noEscapes_local;
  bool escapeQuotes_local;
  string *source_local;
  string *errorstr_local;
  cmMakefile *this_local;
  
  last = (char *)std::__cxx11::string::c_str();
  result.field_2._8_8_ = last;
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)local_58);
  std::vector<t_lookup,_std::allocator<t_lookup>_>::vector
            ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
  bVar3 = false;
  bVar8 = false;
  state._0_4_ = LOG;
  pcVar10 = GetCMakeInstance(this);
  this_00 = cmake::GetState(pcVar10);
  do {
    var.loc._7_1_ = *last;
    if (var.loc._7_1_ == '\0') {
      bVar8 = true;
    }
    else if (var.loc._7_1_ == '\n') {
      line = line + 1;
    }
    else if (var.loc._7_1_ == '$') {
      if (atOnly) {
LAB_005a3bf3:
        if (!noEscapes) {
          cVar1 = last[1];
          if (cVar1 == 't') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            std::__cxx11::string::append((char *)local_58);
            result.field_2._8_8_ = last + 2;
          }
          else if (cVar1 == 'n') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            std::__cxx11::string::append((char *)local_58);
            result.field_2._8_8_ = last + 2;
          }
          else if (cVar1 == 'r') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            std::__cxx11::string::append((char *)local_58);
            result.field_2._8_8_ = last + 2;
          }
          else if ((cVar1 != ';') ||
                  (bVar7 = std::vector<t_lookup,_std::allocator<t_lookup>_>::empty
                                     ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype), !bVar7
                  )) {
            iVar9 = isalnum((int)cVar1);
            if ((iVar9 == 0) && (cVar1 != '\0')) {
              std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
              result.field_2._8_8_ = last + 1;
            }
            else {
              std::__cxx11::string::operator+=((string *)errorstr,"Invalid character escape \'\\");
              if (cVar1 == '\0') {
                std::__cxx11::string::operator+=((string *)errorstr,"\' (at end of input).");
              }
              else {
                std::__cxx11::string::operator+=((string *)errorstr,cVar1);
                std::__cxx11::string::operator+=((string *)errorstr,"\'.");
              }
              bVar3 = true;
            }
          }
          if (*(char *)result.field_2._8_8_ != '\0') {
            last = last + 1;
          }
        }
      }
      else {
        t_lookup::t_lookup((t_lookup *)&next);
        start = last + 1;
        pcStack_600 = (char *)0x0;
        local_601 = *start;
        if (local_601 == '{') {
          pcStack_600 = last + 2;
          next._0_4_ = 0;
        }
        else if (local_601 != '<') {
          if (local_601 == '\0') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            result.field_2._8_8_ = start;
          }
          else {
            bVar7 = cmHasLiteralPrefix<char_const*,5ul>(&start,(char (*) [5])"ENV{");
            if (bVar7) {
              pcStack_600 = last + 5;
              next._0_4_ = 1;
            }
            else {
              bVar7 = cmHasLiteralPrefix<char_const*,7ul>(&start,(char (*) [7])"CACHE{");
              if (bVar7) {
                pcStack_600 = last + 7;
                next._0_4_ = 2;
              }
              else {
                bVar7 = cmsys::RegularExpression::find(&this->cmNamedCurly,start);
                pcVar12 = start;
                if (bVar7) {
                  sVar14 = cmsys::RegularExpression::end(&this->cmNamedCurly);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_668,pcVar12,sVar14,(allocator *)((long)&next_1 + 7));
                  std::operator+(&local_648,"Syntax $",&local_668);
                  std::operator+(&local_628,&local_648,
                                 "{} is not supported.  Only ${}, $ENV{}, and $CACHE{} are allowed."
                                );
                  std::__cxx11::string::operator=((string *)errorstr,(string *)&local_628);
                  std::__cxx11::string::~string((string *)&local_628);
                  std::__cxx11::string::~string((string *)&local_648);
                  std::__cxx11::string::~string((string *)&local_668);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&next_1 + 7));
                  state._0_4_ = FATAL_ERROR;
                  bVar3 = true;
                }
              }
            }
          }
        }
        if (pcStack_600 != (char *)0x0) {
          std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
          result.field_2._8_8_ = pcStack_600;
          last = pcStack_600 + -1;
          lookup_1._0_8_ = std::__cxx11::string::size();
          std::vector<t_lookup,_std::allocator<t_lookup>_>::push_back
                    ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype,(value_type *)&next);
        }
      }
    }
    else if (var.loc._7_1_ == '@') {
      if ((((replaceAt) &&
           (pcVar12 = strchr(last + 1,0x40), variable.field_2._8_8_ = pcVar12,
           pcVar12 != (char *)0x0)) && (pcVar12 != last + 1)) &&
         (sVar15 = strspn(last + 1,
                          "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-"),
         pcVar12 == last + sVar15 + 1)) {
        uVar16 = ~(ulong)last + variable.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_6a8,last + 1,uVar16,
                   (allocator *)(varresult_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator
                  ((allocator<char> *)(varresult_1.field_2._M_local_buf + 0xf));
        pcVar12 = GetSafeDefinition(this,(string *)local_6a8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_6d0,pcVar12,&local_6d1);
        std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
        if (escapeQuotes) {
          cmSystemTools::EscapeQuotes(&local_6f8,(string *)local_6d0);
          std::__cxx11::string::operator=((string *)local_6d0,(string *)&local_6f8);
          std::__cxx11::string::~string((string *)&local_6f8);
        }
        std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
        std::__cxx11::string::append(local_58);
        last = (char *)variable.field_2._8_8_;
        result.field_2._8_8_ = variable.field_2._8_8_ + 1;
        std::__cxx11::string::~string((string *)local_6d0);
        std::__cxx11::string::~string((string *)local_6a8);
      }
      else {
LAB_005a4053:
        bVar7 = std::vector<t_lookup,_std::allocator<t_lookup>_>::empty
                          ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
        if ((((!bVar7) && (iVar9 = isalnum((int)var.loc._7_1_), iVar9 == 0)) &&
            ((var.loc._7_1_ != '_' &&
             (((var.loc._7_1_ != '/' && (var.loc._7_1_ != '.')) && (var.loc._7_1_ != '+')))))) &&
           (var.loc._7_1_ != '-')) {
          std::__cxx11::string::operator+=((string *)errorstr,"Invalid character (\'");
          std::__cxx11::string::operator+=((string *)errorstr,var.loc._7_1_);
          std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
          std::vector<t_lookup,_std::allocator<t_lookup>_>::back
                    ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
          std::__cxx11::string::substr((ulong)&local_758,(ulong)local_58);
          std::operator+(&local_738,"\') in a variable name: \'",&local_758);
          std::operator+(&local_718,&local_738,"\'");
          std::__cxx11::string::operator+=((string *)errorstr,(string *)&local_718);
          std::__cxx11::string::~string((string *)&local_718);
          std::__cxx11::string::~string((string *)&local_738);
          std::__cxx11::string::~string((string *)&local_758);
          state._0_4_ = FATAL_ERROR;
          bVar3 = true;
        }
      }
    }
    else {
      if (var.loc._7_1_ == '\\') goto LAB_005a3bf3;
      if (var.loc._7_1_ != '}') goto LAB_005a4053;
      bVar7 = std::vector<t_lookup,_std::allocator<t_lookup>_>::empty
                        ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
      if (!bVar7) {
        pvVar11 = std::vector<t_lookup,_std::allocator<t_lookup>_>::back
                            ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
        lookup = *(string **)pvVar11;
        var._0_8_ = pvVar11->loc;
        std::vector<t_lookup,_std::allocator<t_lookup>_>::pop_back
                  ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
        std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
        std::__cxx11::string::substr((ulong)&value,(ulong)local_58);
        local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value;
        varresult.field_2._8_8_ = 0;
        std::__cxx11::string::string(local_f8);
        if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
             ::lineVar_abi_cxx11_ == '\0') &&
           (iVar9 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                                         ::lineVar_abi_cxx11_), iVar9 != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)
                     &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                      ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE",&local_f9);
          std::allocator<char>::~allocator((allocator<char> *)&local_f9);
          __cxa_atexit(std::__cxx11::string::~string,
                       &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                        ::lineVar_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                               ::lineVar_abi_cxx11_);
        }
        if ((int)lookup == 0) {
          if ((filename == (char *)0x0) ||
             (_Var5 = std::operator==(local_b0,&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                                                ::lineVar_abi_cxx11_), !_Var5)) {
            varresult.field_2._8_8_ = GetDefinition(this,local_b0);
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_278);
            std::ostream::operator<<(local_278,line);
            std::__cxx11::ostringstream::str();
            std::__cxx11::string::operator=(local_f8,local_298);
            std::__cxx11::string::~string(local_298);
            std::__cxx11::ostringstream::~ostringstream(local_278);
          }
        }
        else if ((int)lookup == 1) {
          pcVar12 = (char *)std::__cxx11::string::c_str();
          varresult.field_2._8_8_ = cmsys::SystemTools::GetEnv(pcVar12);
        }
        else if ((int)lookup == 2) {
          varresult.field_2._8_8_ = cmState::GetCacheEntryValue(this_00,local_b0);
        }
        uVar4 = varresult.field_2._8_8_;
        if (varresult.field_2._8_8_ == 0) {
          if (!removeEmpty) {
            pcVar10 = GetCMakeInstance(this);
            bVar7 = cmake::GetWarnUninitialized(pcVar10);
            if ((bVar7) && (bVar7 = VariableInitialized(this,local_b0), !bVar7)) {
              local_302 = 0;
              local_303 = 0;
              local_32a = 0;
              local_32b = 0;
              local_352 = 0;
              local_353 = 0;
              bVar2 = false;
              bVar7 = false;
              local_96b = true;
              if ((this->CheckSystemVars & 1U) == 0) {
                std::allocator<char>::allocator();
                local_302 = 1;
                std::__cxx11::string::string((string *)&local_300,filename,&local_301);
                local_303 = 1;
                pcVar12 = GetHomeDirectory(this);
                std::allocator<char>::allocator();
                local_32a = 1;
                std::__cxx11::string::string((string *)&local_328,pcVar12,&local_329);
                local_32b = 1;
                bVar6 = cmsys::SystemTools::IsSubDirectory(&local_300,&local_328);
                local_96b = true;
                if (!bVar6) {
                  std::allocator<char>::allocator();
                  local_352 = 1;
                  std::__cxx11::string::string((string *)&local_350,filename,&local_351);
                  local_353 = 1;
                  pcVar12 = GetHomeOutputDirectory(this);
                  std::allocator<char>::allocator();
                  bVar2 = true;
                  std::__cxx11::string::string((string *)&local_378,pcVar12,&local_379);
                  bVar7 = true;
                  local_96b = cmsys::SystemTools::IsSubDirectory(&local_350,&local_378);
                }
              }
              if (bVar7) {
                std::__cxx11::string::~string((string *)&local_378);
              }
              if (bVar2) {
                std::allocator<char>::~allocator((allocator<char> *)&local_379);
              }
              if ((local_353 & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_350);
              }
              if ((local_352 & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_351);
              }
              if ((local_32b & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_328);
              }
              if ((local_32a & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_329);
              }
              if ((local_303 & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_300);
              }
              if ((local_302 & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_301);
              }
              if (local_96b != false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&lfc.Line);
                cmListFileContext::cmListFileContext
                          ((cmListFileContext *)&converter.LinkScriptShell);
                local_568 = (this->StateSnapshot).Position.Position;
                local_578 = (this->StateSnapshot).State;
                pcStack_570 = (this->StateSnapshot).Position.Tree;
                cmOutputConverter::cmOutputConverter
                          ((cmOutputConverter *)local_560,this->StateSnapshot);
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_5b8,filename,&local_5b9);
                cmOutputConverter::Convert
                          (&local_598,(cmOutputConverter *)local_560,&local_5b8,HOME,UNCHANGED);
                std::__cxx11::string::operator=
                          ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_598);
                std::__cxx11::string::~string((string *)&local_598);
                std::__cxx11::string::~string((string *)&local_5b8);
                std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
                lfc.FilePath.field_2._8_8_ = line;
                poVar17 = std::operator<<((ostream *)&lfc.Line,"uninitialized variable \'");
                poVar17 = std::operator<<(poVar17,(string *)local_b0);
                std::operator<<(poVar17,"\'");
                pcVar10 = GetCMakeInstance(this);
                std::__cxx11::ostringstream::str();
                cmake::IssueMessage(pcVar10,AUTHOR_WARNING,(string *)&lookup_1.loc,
                                    (cmListFileContext *)&converter.LinkScriptShell,false);
                std::__cxx11::string::~string((string *)&lookup_1.loc);
                cmListFileContext::~cmListFileContext
                          ((cmListFileContext *)&converter.LinkScriptShell);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lfc.Line);
              }
            }
          }
        }
        else if (escapeQuotes) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2d8,(char *)uVar4,&local_2d9);
          cmSystemTools::EscapeQuotes(&local_2b8,&local_2d8);
          std::__cxx11::string::operator=(local_f8,(string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
        }
        else {
          std::__cxx11::string::operator=(local_f8,(char *)varresult.field_2._8_8_);
        }
        uVar4 = var._0_8_;
        lVar13 = std::__cxx11::string::size();
        std::__cxx11::string::replace((ulong)local_58,uVar4,(string *)(lVar13 - var._0_8_));
        result.field_2._8_8_ = last + 1;
        std::__cxx11::string::~string(local_f8);
        std::__cxx11::string::~string((string *)&value);
      }
    }
    bVar7 = false;
    if ((!bVar3) && (bVar7 = false, !bVar8)) {
      bVar7 = last[1] != '\0';
      last = last + 1;
    }
    if (!bVar7) {
      if ((!bVar3) &&
         (bVar8 = std::vector<t_lookup,_std::allocator<t_lookup>_>::empty
                            ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype), !bVar8)) {
        std::__cxx11::string::operator+=
                  ((string *)errorstr,"There is an unterminated variable reference.");
        bVar3 = true;
      }
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8d0);
        std::operator<<((ostream *)local_8d0,"Syntax error in cmake code ");
        if (filename != (char *)0x0) {
          poVar17 = std::operator<<((ostream *)local_8d0,"at\n");
          poVar17 = std::operator<<(poVar17,"  ");
          poVar17 = std::operator<<(poVar17,filename);
          poVar17 = std::operator<<(poVar17,":");
          poVar17 = (ostream *)std::ostream::operator<<(poVar17,line);
          std::operator<<(poVar17,"\n");
        }
        poVar17 = std::operator<<((ostream *)local_8d0,"when parsing string\n");
        poVar17 = std::operator<<(poVar17,"  ");
        poVar17 = std::operator<<(poVar17,(string *)source);
        std::operator<<(poVar17,"\n");
        std::operator<<((ostream *)local_8d0,(string *)errorstr);
        state._0_4_ = FATAL_ERROR;
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)errorstr,local_8f0);
        std::__cxx11::string::~string(local_8f0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8d0);
      }
      else {
        std::__cxx11::string::append((char *)local_58);
        std::__cxx11::string::operator=((string *)source,local_58);
      }
      std::vector<t_lookup,_std::allocator<t_lookup>_>::~vector
                ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
      std::__cxx11::string::~string(local_58);
      return (MessageType)state;
    }
  } while( true );
}

Assistant:

cmake::MessageType cmMakefile::ExpandVariablesInStringNew(
                                            std::string& errorstr,
                                            std::string& source,
                                            bool escapeQuotes,
                                            bool noEscapes,
                                            bool atOnly,
                                            const char* filename,
                                            long line,
                                            bool removeEmpty,
                                            bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::vector<t_lookup> openstack;
  bool error = false;
  bool done = false;
  cmake::MessageType mtype = cmake::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  do
    {
    char inc = *in;
    switch(inc)
      {
      case '}':
        if(!openstack.empty())
          {
          t_lookup var = openstack.back();
          openstack.pop_back();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          const char* value = NULL;
          std::string varresult;
          static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
          switch(var.domain)
            {
            case NORMAL:
              if(filename && lookup == lineVar)
                {
                std::ostringstream ostr;
                ostr << line;
                varresult = ostr.str();
                }
              else
                {
                value = this->GetDefinition(lookup);
                }
              break;
            case ENVIRONMENT:
              value = cmSystemTools::GetEnv(lookup.c_str());
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
            }
          // Get the string we're meant to append to.
          if(value)
            {
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(value);
              }
            else
              {
              varresult = value;
              }
            }
          else if(!removeEmpty)
            {
            // check to see if we need to print a warning
            // if strict mode is on and the variable has
            // not been "cleared"/initialized with a set(foo ) call
            if(this->GetCMakeInstance()->GetWarnUninitialized() &&
               !this->VariableInitialized(lookup))
              {
              if (this->CheckSystemVars ||
                  cmSystemTools::IsSubDirectory(filename,
                                                this->GetHomeDirectory()) ||
                  cmSystemTools::IsSubDirectory(filename,
                                             this->GetHomeOutputDirectory()))
                {
                std::ostringstream msg;
                cmListFileContext lfc;
                cmOutputConverter converter(this->StateSnapshot);
                lfc.FilePath =
                    converter.Convert(filename, cmOutputConverter::HOME);
                lfc.Line = line;
                msg << "uninitialized variable \'" << lookup << "\'";
                this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                                       msg.str(), lfc);
                }
              }
            }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
          }
        break;
      case '$':
        if(!atOnly)
          {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = NULL;
          char nextc = *next;
          if(nextc == '{')
            {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
            }
          else if(nextc == '<')
            {
            }
          else if(!nextc)
            {
            result.append(last, next - last);
            last = next;
            }
          else if(cmHasLiteralPrefix(next, "ENV{"))
            {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
            }
          else if(cmHasLiteralPrefix(next, "CACHE{"))
            {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
            }
          else
            {
            if(this->cmNamedCurly.find(next))
              {
              errorstr = "Syntax $"
                  + std::string(next, this->cmNamedCurly.end())
                  + "{} is not supported.  Only ${}, $ENV{}, "
                    "and $CACHE{} are allowed.";
              mtype = cmake::FATAL_ERROR;
              error = true;
              }
            }
          if(start)
            {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push_back(lookup);
            }
          break;
          }
      case '\\':
        if(!noEscapes)
          {
          const char* next = in + 1;
          char nextc = *next;
          if(nextc == 't')
            {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
            }
          else if(nextc == 'n')
            {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
            }
          else if(nextc == 'r')
            {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
            }
          else if(nextc == ';' && openstack.empty())
            {
            // Handled in ExpandListArgument; pass the backslash literally.
            }
          else if (isalnum(nextc) || nextc == '\0')
            {
            errorstr += "Invalid character escape '\\";
            if (nextc)
              {
              errorstr += nextc;
              errorstr += "'.";
              }
            else
              {
              errorstr += "' (at end of input).";
              }
            error = true;
            }
          else
            {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
            }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if(*last)
            {
            ++in;
            }
          }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if(replaceAt)
          {
          const char* nextAt = strchr(in + 1, '@');
          if(nextAt && nextAt != in + 1 &&
             nextAt == in + 1 + strspn(in + 1,
                "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                "abcdefghijklmnopqrstuvwxyz"
                "0123456789/_.+-"))
            {
            std::string variable(in + 1, nextAt - in - 1);
            std::string varresult = this->GetSafeDefinition(variable);
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(varresult);
              }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
            }
          }
        // Failed to find a valid @ expansion; treat it as literal.
        /* FALLTHROUGH */
      default:
        {
        if(!openstack.empty() &&
           !(isalnum(inc) || inc == '_' ||
             inc == '/' || inc == '.' ||
             inc == '+' || inc == '-'))
          {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" + result.substr(openstack.back().loc) + "'";
          mtype = cmake::FATAL_ERROR;
          error = true;
          }
        break;
        }
      }
    // Look at the next character.
    } while(!error && !done && *++in);

  // Check for open variable references yet.
  if(!error && !openstack.empty())
    {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
    }

  if(error)
    {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if(filename)
      {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
            << "  " << filename << ":" << line << "\n";
      }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = cmake::FATAL_ERROR;
    errorstr = emsg.str();
    }
  else
    {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
    }

  return mtype;
}